

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void assign_frame_buffer_p(RefCntBuffer **lhs_ptr,RefCntBuffer *rhs_ptr)

{
  RefCntBuffer *pRVar1;
  RefCntBuffer *old_ptr;
  RefCntBuffer *rhs_ptr_local;
  RefCntBuffer **lhs_ptr_local;
  
  pRVar1 = *lhs_ptr;
  if (pRVar1 != (RefCntBuffer *)0x0) {
    pRVar1->ref_count = pRVar1->ref_count + -1;
  }
  *lhs_ptr = rhs_ptr;
  rhs_ptr->ref_count = rhs_ptr->ref_count + 1;
  return;
}

Assistant:

static inline void assign_frame_buffer_p(RefCntBuffer **lhs_ptr,
                                         RefCntBuffer *rhs_ptr) {
  RefCntBuffer *const old_ptr = *lhs_ptr;
  if (old_ptr != NULL) {
    assert(old_ptr->ref_count > 0);
    // One less reference to the buffer at 'old_ptr', so decrease ref count.
    --old_ptr->ref_count;
  }

  *lhs_ptr = rhs_ptr;
  // One more reference to the buffer at 'rhs_ptr', so increase ref count.
  ++rhs_ptr->ref_count;
}